

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.hpp
# Opt level: O0

void __thiscall
websocketpp::http::parser::response::process(response *this,iterator begin,iterator end)

{
  bool bVar1;
  byte bVar2;
  exception *peVar3;
  allocator<char> local_3f1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e8;
  string local_3e0;
  undefined1 local_3b9;
  string local_3b8;
  string local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_348;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_340;
  string local_338 [32];
  istringstream local_318 [8];
  istringstream ss;
  value local_198;
  undefined1 local_191;
  int code;
  string local_170;
  allocator<char> local_149;
  string local_148;
  char local_121;
  response *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  allocator<char> local_f9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  string local_e8;
  undefined1 local_c1;
  string local_c0;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  char local_41;
  char *local_40;
  char *local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  iterator cursor_end;
  iterator cursor_start;
  response *this_local;
  iterator end_local;
  iterator begin_local;
  
  local_41 = ' ';
  local_40 = end._M_current;
  local_38 = begin._M_current;
  cursor_end = begin;
  this_local = (response *)end._M_current;
  end_local = begin;
  local_30 = std::find<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                       (begin._M_current,end._M_current,&local_41);
  bVar1 = __gnu_cxx::operator==
                    (&local_30,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&this_local);
  if (bVar1) {
    local_c1 = 1;
    peVar3 = (exception *)__cxa_allocate_exception(0x70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Invalid response line",&local_69);
    std::__cxx11::string::string((string *)&local_a0);
    std::__cxx11::string::string((string *)&local_c0);
    exception::exception(peVar3,&local_68,bad_request,&local_a0,&local_c0);
    local_c1 = 0;
    __cxa_throw(peVar3,&exception::typeinfo,exception::~exception);
  }
  local_f0._M_current = cursor_end._M_current;
  local_f8._M_current = local_30._M_current;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((string *)&local_e8,local_f0,local_f8,&local_f9);
  parser::set_version(&this->super_parser,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_f9);
  local_118 = (char *)__gnu_cxx::
                      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator+(&local_30,1);
  local_120 = this_local;
  local_121 = ' ';
  local_108 = local_118;
  cursor_end._M_current = local_118;
  local_110 = (char *)std::find<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                                ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_118,
                                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )this_local,&local_121);
  local_30 = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_110;
  bVar1 = __gnu_cxx::operator==
                    (&local_30,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&this_local);
  if (!bVar1) {
    local_340._M_current = cursor_end._M_current;
    local_348._M_current = local_30._M_current;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              (local_338,local_340,local_348,&local_349);
    std::__cxx11::istringstream::istringstream(local_318,local_338,8);
    std::__cxx11::string::~string(local_338);
    std::allocator<char>::~allocator(&local_349);
    std::istream::operator>>(local_318,(int *)&local_198);
    bVar2 = std::ios::fail();
    if ((bVar2 & 1) == 0) {
      local_3e8 = __gnu_cxx::
                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator+(&local_30,1);
      local_3f0._M_current = (char *)this_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                ((string *)&local_3e0,local_3e8,local_3f0,&local_3f1);
      set_status(this,local_198,&local_3e0);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::allocator<char>::~allocator(&local_3f1);
      std::__cxx11::istringstream::~istringstream(local_318);
      return;
    }
    local_3b9 = 1;
    peVar3 = (exception *)__cxa_allocate_exception(0x70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,"Unable to parse response code",&local_371);
    std::__cxx11::string::string((string *)&local_398);
    std::__cxx11::string::string((string *)&local_3b8);
    exception::exception(peVar3,&local_370,bad_request,&local_398,&local_3b8);
    local_3b9 = 0;
    __cxa_throw(peVar3,&exception::typeinfo,exception::~exception);
  }
  local_191 = 1;
  peVar3 = (exception *)__cxa_allocate_exception(0x70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"Invalid request line",&local_149);
  std::__cxx11::string::string((string *)&local_170);
  std::__cxx11::string::string((string *)&code);
  exception::exception(peVar3,&local_148,bad_request,&local_170,(string *)&code);
  local_191 = 0;
  __cxa_throw(peVar3,&exception::typeinfo,exception::~exception);
}

Assistant:

inline void response::process(std::string::iterator begin,
    std::string::iterator end)
{
    std::string::iterator cursor_start = begin;
    std::string::iterator cursor_end = std::find(begin,end,' ');

    if (cursor_end == end) {
        throw exception("Invalid response line",status_code::bad_request);
    }

    set_version(std::string(cursor_start,cursor_end));

    cursor_start = cursor_end+1;
    cursor_end = std::find(cursor_start,end,' ');

    if (cursor_end == end) {
        throw exception("Invalid request line",status_code::bad_request);
    }

    int code;

    std::istringstream ss(std::string(cursor_start,cursor_end));

    if ((ss >> code).fail()) {
        throw exception("Unable to parse response code",status_code::bad_request);
    }

    set_status(status_code::value(code),std::string(cursor_end+1,end));
}